

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall ncnn::Net::Net(Net *this)

{
  NetPrivate *pNVar1;
  
  this->_vptr_Net = (_func_int **)&PTR__Net_005aa848;
  Option::Option(&this->opt);
  pNVar1 = (NetPrivate *)operator_new(0xd8);
  pNVar1->opt = &this->opt;
  memset(&pNVar1->blobs,0,0xd0);
  this->d = pNVar1;
  return;
}

Assistant:

Net::Net()
    : d(new NetPrivate(opt))
{
}